

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  TransparentHasher *in_RDI;
  int in_stack_ffffffffffffffac;
  Test *in_stack_ffffffffffffffc0;
  key_equal *in_stack_ffffffffffffffc8;
  hasher *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffe0;
  
  testing::Test::Test(in_stack_ffffffffffffffc0);
  *(undefined ***)&in_RDI->super_Hasher = &PTR__HashtableTest_012fe218;
  TransparentHasher::TransparentHasher(in_RDI,in_stack_ffffffffffffffac);
  TransparentHasher::TransparentHasher(in_RDI,in_stack_ffffffffffffffac);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0,0,
             (int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(allocator_type *)in_stack_ffffffffffffffc0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

HashtableTest() : ht_() {}